

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

void __thiscall tinyusdz::crate::CrateReader::~CrateReader(CrateReader *this)

{
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->unpackRecursionGuard)._M_h);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::
  _Rb_tree<tinyusdz::crate::Index,_std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>,_std::_Select1st<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>,_std::less<tinyusdz::crate::Index>,_std::allocator<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>_>
  ::~_Rb_tree(&(this->_live_fieldsets)._M_t);
  ::std::
  vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>::
  ~vector(&this->_nodes);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&this->_elemPaths);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&this->_paths);
  ::std::_Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>::~_Vector_base
            (&(this->_specs).
              super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>);
  ::std::_Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::
  ~_Vector_base(&(this->_fieldset_indices).
                 super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
               );
  ::std::_Vector_base<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>::
  ~_Vector_base(&(this->_fields).
                 super__Vector_base<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>
               );
  ::std::_Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::
  ~_Vector_base(&(this->_string_indices).
                 super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
               );
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&this->_tokens);
  ::std::_Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>::
  ~_Vector_base((_Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_> *
                )&this->_toc);
  return;
}

Assistant:

CrateReader::~CrateReader() {
  //delete _impl;
  //_impl = nullptr;
}